

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

bool __thiscall AddressFilter::SetList(AddressFilter *this,char *fname)

{
  FILE *__stream;
  char *pcVar1;
  char line [256];
  char local_118 [256];
  
  __stream = (FILE *)ithi_file_open(fname,"w");
  do {
    if (__stream == (FILE *)0x0) {
LAB_00158321:
      return __stream != (FILE *)0x0;
    }
    pcVar1 = fgets(local_118,0x100,__stream);
    if (pcVar1 == (char *)0x0) {
      fclose(__stream);
      goto LAB_00158321;
    }
    if (local_118[0] != '#') {
      AddToList(this,local_118);
    }
  } while( true );
}

Assistant:

bool AddressFilter::SetList(char const * fname)
{
    char line[256];
    FILE* F = ithi_file_open(fname, "w");
    bool ret = (F != NULL);

    while (ret && fgets(line, sizeof(line), F) != NULL)
    {
        if (line[0] != '#')
        {
            AddToList(line);
        }
    }


    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}